

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O3

void __thiscall
AixLog::SinkFormat::do_log(SinkFormat *this,ostream *stream,Metadata *metadata,string *message)

{
  pointer pcVar1;
  ulong uVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  Severity logSeverity;
  Severity logSeverity_00;
  string result;
  stringstream ss;
  string local_208;
  string local_1e8;
  TextColor local_1c8;
  TextColor local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  pcVar1 = (this->format_)._M_dataplus._M_p;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,pcVar1,pcVar1 + (this->format_)._M_string_length);
  if ((metadata->timestamp).is_null_ == false) {
    Timestamp::to_string((string *)local_1b8,&metadata->timestamp,&local_208);
    std::__cxx11::string::operator=((string *)&local_208,(string *)local_1b8);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
  }
  uVar2 = std::__cxx11::string::find((char *)&local_208,0x1b655b,0);
  if (uVar2 != 0xffffffffffffffff) {
    to_string_abi_cxx11_
              ((string *)local_1b8,(AixLog *)(ulong)(uint)(int)(char)metadata->severity,logSeverity)
    ;
    std::__cxx11::string::replace((ulong)&local_208,uVar2,(char *)0x9,local_1b8._0_8_);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
  }
  uVar2 = std::__cxx11::string::find((char *)&local_208,0x1b6565,0);
  if (uVar2 != 0xffffffffffffffff) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    local_1c0.foreground = RED;
    local_1c0.background = NONE;
    AixLog::operator<<((ostream *)(local_1b8 + 0x10),&local_1c0);
    to_string_abi_cxx11_
              (&local_1e8,(AixLog *)(ulong)(uint)(int)(char)metadata->severity,logSeverity_00);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_1b8 + 0x10),local_1e8._M_dataplus._M_p,
                        local_1e8._M_string_length);
    local_1c8.foreground = NONE;
    local_1c8.background = NONE;
    AixLog::operator<<(poVar3,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::replace
              ((ulong)&local_208,uVar2,(char *)0xf,(ulong)local_1e8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  uVar2 = std::__cxx11::string::find((char *)&local_208,0x1b6575,0);
  if (uVar2 == 0xffffffffffffffff) goto LAB_0014700c;
  if ((metadata->tag).is_null_ == true) {
    if ((metadata->function).is_null_ == false) {
      lVar4 = 0x48;
      lVar5 = 0x40;
      goto LAB_00146fb9;
    }
    local_1b8._0_8_ = local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"log","");
  }
  else {
    lVar4 = 0x18;
    lVar5 = 0x10;
LAB_00146fb9:
    local_1b8._0_8_ = local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1b8,*(long *)(&metadata->severity + lVar5),
               *(long *)(&metadata->severity + lVar4) + *(long *)(&metadata->severity + lVar5));
  }
  std::__cxx11::string::replace((ulong)&local_208,uVar2,(char *)0x9,local_1b8._0_8_);
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
  }
LAB_0014700c:
  uVar2 = std::__cxx11::string::find((char *)&local_208,0x1b657f,0);
  if (uVar2 != 0xffffffffffffffff) {
    if ((metadata->tag).is_null_ == false) {
      local_1b8._0_8_ = local_1b8 + 0x10;
      pcVar1 = (metadata->tag).text._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b8,pcVar1,pcVar1 + (metadata->tag).text._M_string_length);
    }
    else {
      local_1b8._0_8_ = local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"");
    }
    std::__cxx11::string::replace((ulong)&local_208,uVar2,(char *)0x4,local_1b8._0_8_);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
  }
  uVar2 = std::__cxx11::string::find((char *)&local_208,0x1b6584,0);
  if (uVar2 != 0xffffffffffffffff) {
    if ((metadata->function).is_null_ == false) {
      local_1b8._0_8_ = local_1b8 + 0x10;
      pcVar1 = (metadata->function).name._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b8,pcVar1,pcVar1 + (metadata->function).name._M_string_length);
    }
    else {
      local_1b8._0_8_ = local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"");
    }
    std::__cxx11::string::replace((ulong)&local_208,uVar2,(char *)0x9,local_1b8._0_8_);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
  }
  uVar2 = std::__cxx11::string::find((char *)&local_208,0x1b658e,0);
  if (uVar2 == 0xffffffffffffffff) {
    if ((local_208._M_string_length == 0) ||
       (local_208._M_dataplus._M_p[local_208._M_string_length - 1] == ' ')) {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (stream,local_208._M_dataplus._M_p,local_208._M_string_length);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(message->_M_dataplus)._M_p,message->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    }
    else {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (stream,local_208._M_dataplus._M_p,local_208._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(message->_M_dataplus)._M_p,message->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    }
  }
  else {
    std::__cxx11::string::replace
              ((ulong)&local_208,uVar2,(char *)0x8,(ulong)(message->_M_dataplus)._M_p);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,local_208._M_dataplus._M_p,local_208._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  }
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void do_log(std::ostream& stream, const Metadata& metadata,
                      const std::string& message) const {
    std::string result = format_;
    if (metadata.timestamp) result = metadata.timestamp.to_string(result);

    size_t pos = result.find("#severity");
    if (pos != std::string::npos)
      result.replace(pos, 9, to_string(metadata.severity));

    pos = result.find("#color_severity");
    if (pos != std::string::npos) {
      std::stringstream ss;
      ss << TextColor(Color::RED) << to_string(metadata.severity)
         << TextColor(Color::NONE);
      result.replace(pos, 15, ss.str());
    }

    pos = result.find("#tag_func");
    if (pos != std::string::npos)
      result.replace(
          pos, 9,
          metadata.tag ? metadata.tag.text
                       : (metadata.function ? metadata.function.name : "log"));

    pos = result.find("#tag");
    if (pos != std::string::npos)
      result.replace(pos, 4, metadata.tag ? metadata.tag.text : "");

    pos = result.find("#function");
    if (pos != std::string::npos)
      result.replace(pos, 9, metadata.function ? metadata.function.name : "");

    pos = result.find("#message");
    if (pos != std::string::npos) {
      result.replace(pos, 8, message);
      stream << result << std::endl;
    } else {
      if (result.empty() || (result.back() == ' '))
        stream << result << message << std::endl;
      else
        stream << result << " " << message << std::endl;
    }
  }